

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O0

error parse_simple(char *start,char *end,atom *result)

{
  char cVar1;
  long lVar2;
  int iVar3;
  error eVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  double dVar8;
  atom aVar9;
  atom aVar10;
  atom car_val;
  atom car_val_00;
  atom car_val_01;
  atom car_val_02;
  atom car_val_03;
  atom car_val_04;
  atom car_val_05;
  atom car_val_06;
  atom car_val_07;
  atom cdr_val;
  atom cdr_val_00;
  atom cdr_val_01;
  atom cdr_val_02;
  atom cdr_val_03;
  atom cdr_val_04;
  undefined4 uStack_1fc;
  undefined4 uStack_1cc;
  undefined1 local_1b8 [4];
  error err_3;
  atom a1_1;
  undefined4 uStack_174;
  error err_2;
  undefined4 uStack_12c;
  error err_1;
  undefined4 uStack_104;
  long lStack_f0;
  error err;
  long i;
  long length_2;
  atom a2;
  atom a1;
  char *buf;
  char local_91;
  undefined4 uStack_8c;
  char c;
  size_t length_1;
  char *buf_2;
  char *pcStack_58;
  char c_next;
  char *pt;
  char *ps;
  char *buf_1;
  size_t length;
  double val;
  char *p;
  atom *result_local;
  char *end_local;
  char *start_local;
  
  p = (char *)result;
  result_local = (atom *)end;
  end_local = start;
  dVar8 = strtod(start,(char **)&val);
  if ((atom *)val == result_local) {
    p[0] = '\x03';
    p[1] = '\0';
    p[2] = '\0';
    p[3] = '\0';
    *(double *)(p + 8) = dVar8;
  }
  else if (*end_local == '\"') {
    p[0] = '\a';
    p[1] = '\0';
    p[2] = '\0';
    p[3] = '\0';
    pcVar5 = (char *)malloc((long)result_local + (-1 - (long)end_local));
    pcStack_58 = pcVar5;
    pcVar6 = end_local;
    while (pt = pcVar6 + 1, pt < (char *)((long)&result_local[-1].value + 7U)) {
      if (*pt == '\\') {
        cVar1 = pcVar6[2];
        if (cVar1 == 'n') {
          *pcStack_58 = '\n';
        }
        else if (cVar1 == 'r') {
          *pcStack_58 = '\r';
        }
        else if (cVar1 == 't') {
          *pcStack_58 = '\t';
        }
        else {
          *pcStack_58 = cVar1;
        }
        pt = pcVar6 + 2;
      }
      else {
        *pcStack_58 = *pt;
      }
      pcStack_58 = pcStack_58 + 1;
      pcVar6 = pt;
    }
    *pcStack_58 = '\0';
    pcVar5 = (char *)realloc(pcVar5,(size_t)(pcStack_58 + (1 - (long)pcVar5)));
    pcVar6 = p;
    aVar9 = make_string(pcVar5);
    *(ulong *)pcVar6 = CONCAT44(buf_2._4_4_,aVar9.type);
    *(anon_union_8_9_1d3277aa_for_value *)(pcVar6 + 8) = aVar9.value;
  }
  else if (*end_local == '#') {
    pcVar5 = (char *)malloc((long)result_local + (1 - (long)end_local));
    memcpy(pcVar5,end_local,(long)result_local - (long)end_local);
    pcVar6 = p;
    pcVar5[(long)result_local - (long)end_local] = '\0';
    if (((long)result_local - (long)end_local == 3) && (pcVar5[1] == '\\')) {
      aVar9 = make_char(pcVar5[2]);
      *(ulong *)pcVar6 = CONCAT44(uStack_8c,aVar9.type);
      *(anon_union_8_9_1d3277aa_for_value *)(pcVar6 + 8) = aVar9.value;
      free(pcVar5);
    }
    else {
      iVar3 = strcmp(pcVar5,"#\\nul");
      if (iVar3 == 0) {
        local_91 = '\0';
      }
      else {
        iVar3 = strcmp(pcVar5,"#\\return");
        if (iVar3 == 0) {
          local_91 = '\r';
        }
        else {
          iVar3 = strcmp(pcVar5,"#\\newline");
          if (iVar3 == 0) {
            local_91 = '\n';
          }
          else {
            iVar3 = strcmp(pcVar5,"#\\tab");
            if (iVar3 == 0) {
              local_91 = '\t';
            }
            else {
              iVar3 = strcmp(pcVar5,"#\\space");
              if (iVar3 != 0) {
                free(pcVar5);
                return ERROR_SYNTAX;
              }
              local_91 = ' ';
            }
          }
        }
      }
      free(pcVar5);
      pcVar6 = p;
      aVar9 = make_char(local_91);
      *(ulong *)pcVar6 = CONCAT44(buf._4_4_,aVar9.type);
      *(anon_union_8_9_1d3277aa_for_value *)(pcVar6 + 8) = aVar9.value;
    }
  }
  else {
    pcVar6 = (char *)malloc((long)result_local + (1 - (long)end_local));
    memcpy(pcVar6,end_local,(long)result_local - (long)end_local);
    pcVar6[(long)result_local - (long)end_local] = '\0';
    iVar3 = strcmp(pcVar6,"nil");
    if (iVar3 == 0) {
      *(undefined8 *)p = 0;
      *(anon_union_8_9_1d3277aa_for_value *)(p + 8) = (anon_union_8_9_1d3277aa_for_value)0x0;
    }
    else {
      iVar3 = strcmp(pcVar6,".");
      pcVar5 = p;
      if (iVar3 == 0) {
        aVar9 = make_sym(pcVar6);
        *(ulong *)pcVar5 = CONCAT44(a1.value._4_4_,aVar9.type);
        *(anon_union_8_9_1d3277aa_for_value *)(pcVar5 + 8) = aVar9.value;
      }
      else {
        lVar7 = (long)result_local - (long)end_local;
        lStack_f0 = lVar7;
        while (lVar2 = lStack_f0, lStack_f0 = lVar2 + -1, -1 < lStack_f0) {
          if (pcVar6[lStack_f0] == '.') {
            if ((lStack_f0 == 0) || (lStack_f0 == lVar7 + -1)) {
              free(pcVar6);
              return ERROR_SYNTAX;
            }
            eVar4 = parse_simple(pcVar6,pcVar6 + lStack_f0,(atom *)&a2.value);
            if (eVar4 != ERROR_OK) {
              free(pcVar6);
              return ERROR_SYNTAX;
            }
            eVar4 = parse_simple(pcVar6 + lVar2,pcVar6 + lVar7,(atom *)&length_2);
            if (eVar4 != ERROR_OK) {
              free(pcVar6);
              return ERROR_SYNTAX;
            }
            free(pcVar6);
            pcVar6 = p;
            aVar9._4_4_ = 0;
            aVar9.type = (uint)length_2;
            aVar9.value = (anon_union_8_9_1d3277aa_for_value)a2._0_8_;
            aVar9 = cons(aVar9,(atom)ZEXT816(0));
            car_val._4_4_ = 0;
            car_val.type = a2.value._0_4_;
            cdr_val._4_4_ = 0;
            cdr_val.type = aVar9.type;
            car_val.value = (anon_union_8_9_1d3277aa_for_value)a1._0_8_;
            cdr_val.value.number = aVar9.value.number;
            aVar9 = cons(car_val,cdr_val);
            *(ulong *)pcVar6 = CONCAT44(uStack_104,aVar9.type);
            *(anon_union_8_9_1d3277aa_for_value *)(pcVar6 + 8) = aVar9.value;
            return ERROR_OK;
          }
          if (pcVar6[lStack_f0] == '!') {
            if ((lStack_f0 == 0) || (lStack_f0 == lVar7 + -1)) {
              free(pcVar6);
              return ERROR_SYNTAX;
            }
            eVar4 = parse_simple(pcVar6,pcVar6 + lStack_f0,(atom *)&a2.value);
            if (eVar4 != ERROR_OK) {
              free(pcVar6);
              return ERROR_SYNTAX;
            }
            eVar4 = parse_simple(pcVar6 + lVar2,pcVar6 + lVar7,(atom *)&length_2);
            if (eVar4 != ERROR_OK) {
              free(pcVar6);
              return ERROR_SYNTAX;
            }
            free(pcVar6);
            pcVar6 = p;
            car_val_00._4_4_ = 0;
            car_val_00.type = (uint)length_2;
            car_val_00.value = (anon_union_8_9_1d3277aa_for_value)a2._0_8_;
            aVar9 = cons(car_val_00,(atom)ZEXT816(0));
            car_val_01._4_4_ = 0;
            car_val_01.type = sym_quote.type;
            cdr_val_00._4_4_ = 0;
            cdr_val_00.type = aVar9.type;
            car_val_01.value.number = sym_quote.value.number;
            cdr_val_00.value.number = aVar9.value.number;
            aVar9 = cons(car_val_01,cdr_val_00);
            car_val_02._4_4_ = 0;
            car_val_02.type = aVar9.type;
            car_val_02.value.number = aVar9.value.number;
            aVar9 = cons(car_val_02,(atom)ZEXT816(0));
            car_val_03._4_4_ = 0;
            car_val_03.type = a2.value._0_4_;
            cdr_val_01._4_4_ = 0;
            cdr_val_01.type = aVar9.type;
            car_val_03.value = (anon_union_8_9_1d3277aa_for_value)a1._0_8_;
            cdr_val_01.value.number = aVar9.value.number;
            aVar9 = cons(car_val_03,cdr_val_01);
            *(ulong *)pcVar6 = CONCAT44(uStack_12c,aVar9.type);
            *(anon_union_8_9_1d3277aa_for_value *)(pcVar6 + 8) = aVar9.value;
            return ERROR_OK;
          }
          if (pcVar6[lStack_f0] == ':') {
            if ((lStack_f0 == 0) || (lStack_f0 == lVar7 + -1)) {
              free(pcVar6);
              return ERROR_SYNTAX;
            }
            eVar4 = parse_simple(pcVar6,pcVar6 + lStack_f0,(atom *)&a2.value);
            if (eVar4 != ERROR_OK) {
              free(pcVar6);
              return ERROR_SYNTAX;
            }
            eVar4 = parse_simple(pcVar6 + lVar2,pcVar6 + lVar7,(atom *)&length_2);
            if (eVar4 != ERROR_OK) {
              free(pcVar6);
              return ERROR_SYNTAX;
            }
            free(pcVar6);
            pcVar6 = p;
            aVar9 = make_sym("compose");
            car_val_04._4_4_ = 0;
            car_val_04.type = (uint)length_2;
            car_val_04.value = (anon_union_8_9_1d3277aa_for_value)a2._0_8_;
            aVar10 = cons(car_val_04,(atom)ZEXT816(0));
            a1_1.value._0_4_ = aVar10.type;
            car_val_05._4_4_ = 0;
            car_val_05.type = a2.value._0_4_;
            cdr_val_02._4_4_ = 0;
            cdr_val_02.type = a1_1.value._0_4_;
            car_val_05.value = (anon_union_8_9_1d3277aa_for_value)a1._0_8_;
            cdr_val_02.value.number = aVar10.value.number;
            aVar10 = cons(car_val_05,cdr_val_02);
            car_val_06._4_4_ = 0;
            car_val_06.type = aVar9.type;
            cdr_val_03._4_4_ = 0;
            cdr_val_03.type = aVar10.type;
            car_val_06.value.number = aVar9.value.number;
            cdr_val_03.value.number = aVar10.value.number;
            aVar9 = cons(car_val_06,cdr_val_03);
            *(ulong *)pcVar6 = CONCAT44(uStack_174,aVar9.type);
            *(anon_union_8_9_1d3277aa_for_value *)(pcVar6 + 8) = aVar9.value;
            return ERROR_OK;
          }
        }
        if ((1 < lVar7) && (*pcVar6 == '~')) {
          eVar4 = parse_simple(pcVar6 + 1,pcVar6 + lVar7,(atom *)local_1b8);
          free(pcVar6);
          pcVar6 = p;
          if (eVar4 != ERROR_OK) {
            return ERROR_SYNTAX;
          }
          aVar9 = make_sym("complement");
          aVar10._4_4_ = 0;
          aVar10.type = (type)local_1b8;
          aVar10.value = (anon_union_8_9_1d3277aa_for_value)a1_1._0_8_;
          aVar10 = cons(aVar10,(atom)ZEXT816(0));
          car_val_07._4_4_ = 0;
          car_val_07.type = aVar9.type;
          cdr_val_04._4_4_ = 0;
          cdr_val_04.type = aVar10.type;
          car_val_07.value.number = aVar9.value.number;
          cdr_val_04.value.number = aVar10.value.number;
          aVar9 = cons(car_val_07,cdr_val_04);
          *(ulong *)pcVar6 = CONCAT44(uStack_1cc,aVar9.type);
          *(anon_union_8_9_1d3277aa_for_value *)(pcVar6 + 8) = aVar9.value;
          return ERROR_OK;
        }
        aVar9 = make_sym(pcVar6);
        *(ulong *)pcVar5 = CONCAT44(uStack_1fc,aVar9.type);
        *(anon_union_8_9_1d3277aa_for_value *)(pcVar5 + 8) = aVar9.value;
      }
    }
    free(pcVar6);
  }
  return ERROR_OK;
}

Assistant:

error parse_simple(const char *start, const char *end, atom *result)
{
	char *p;

	/* Is it a number? */
	double val = strtod(start, &p);
	if (p == end) {
		result->type = T_NUM;
		result->value.number = val;
		return ERROR_OK;
	}
	else if (start[0] == '"') { /* "string" */
		result->type = T_STRING;
		size_t length = end - start - 2;
		char *buf = (char*)malloc(length + 1);
		const char *ps = start + 1;
		char *pt = buf;
		while (ps < end - 1) {
			if (*ps == '\\') {
				char c_next = *(ps + 1);
				switch (c_next) {
				case 'r':
					*pt = '\r';
					break;
				case 'n':
					*pt = '\n';
					break;
				case 't':
					*pt = '\t';
					break;
				default:
					*pt = c_next;
				}
				ps++;
			}
			else {
				*pt = *ps;
			}
			ps++;
			pt++;
		}
		*pt = 0;
		buf = realloc(buf, pt - buf + 1);
		*result = make_string(buf);
		return ERROR_OK;
	}
	else if (start[0] == '#') { /* #\char */
		char *buf = malloc(end - start + 1);
		memcpy(buf, start, end - start);
		buf[end - start] = 0;
		size_t length = end - start;
		if (length == 3 && buf[1] == '\\') { /* plain character e.g. #\a */
			*result = make_char(buf[2]);
			free(buf);
			return ERROR_OK;
		}
		else {
			char c;
			if (strcmp(buf, "#\\nul") == 0)
				c = '\0';
			else if (strcmp(buf, "#\\return") == 0)
				c = '\r';
			else if (strcmp(buf, "#\\newline") == 0)
				c = '\n';
			else if (strcmp(buf, "#\\tab") == 0)
				c = '\t';
			else if (strcmp(buf, "#\\space") == 0)
				c = ' ';
			else {
				free(buf);
				return ERROR_SYNTAX;
			}
			free(buf);
			*result = make_char(c);
			return ERROR_OK;
		}
	}

	/* NIL or symbol */
	char *buf = malloc(end - start + 1);
	memcpy(buf, start, end - start);
	buf[end - start] = 0;

	if (strcmp(buf, "nil") == 0)
		*result = nil;
	else if (strcmp(buf, ".") == 0)
		*result = make_sym(buf);
	else {
		atom a1, a2;
		long length = end - start, i;
		for (i = length - 1; i >= 0; i--) { /* left-associative */
			if (buf[i] == '.') { /* a.b => (a b) */
				if (i == 0 || i == length - 1) {
					free(buf);
					return ERROR_SYNTAX;
				}
				error err;
				err = parse_simple(buf, buf + i, &a1);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				err = parse_simple(buf + i + 1, buf + length, &a2);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				free(buf);
				*result = cons(a1, cons(a2, nil));
				return ERROR_OK;
			}
			else if (buf[i] == '!') { /* a!b => (a 'b) */
				if (i == 0 || i == length - 1) {
					free(buf);
					return ERROR_SYNTAX;
				}
				error err;
				err = parse_simple(buf, buf + i, &a1);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				err = parse_simple(buf + i + 1, buf + length, &a2);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				free(buf);
				*result = cons(a1, cons(cons(sym_quote, cons(a2, nil)), nil));
				return ERROR_OK;
			}
			else if (buf[i] == ':') { /* a:b => (compose a b) */
				if (i == 0 || i == length - 1) {
					free(buf);
					return ERROR_SYNTAX;
				}
				error err;
				err = parse_simple(buf, buf + i, &a1);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				err = parse_simple(buf + i + 1, buf + length, &a2);
				if (err) {
					free(buf);
					return ERROR_SYNTAX;
				}
				free(buf);
				*result = cons(make_sym("compose"), cons(a1, cons(a2, nil)));
				return ERROR_OK;
			}
		}
		if (length >= 2 && buf[0] == '~') { /* ~a => (complement a) */
			atom a1;
			error err = parse_simple(buf + 1, buf + length, &a1);
			free(buf);
			if (err) {
				return ERROR_SYNTAX;
			}
			*result = cons(make_sym("complement"), cons(a1, nil));
			return ERROR_OK;
		}
		*result = make_sym(buf);
	}

	free(buf);
	return ERROR_OK;
}